

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

size_t appendEscapedSubstring(char *str,size_t i)

{
  char v;
  byte bVar1;
  byte *pbVar2;
  
  bVar1 = *str;
  if (bVar1 != 0) {
    pbVar2 = (byte *)(str + 1);
    do {
      if (bVar1 < 0x22) {
        if (bVar1 == 9) {
          bVar1 = 0x74;
        }
        else if (bVar1 == 10) {
          bVar1 = 0x6e;
        }
        else {
          if (bVar1 != 0xd) goto LAB_0010f362;
          bVar1 = 0x72;
        }
joined_r0x0010f34d:
        if (i < 0x100) {
          yylval.symName[i] = '\\';
          i = i + 1;
          goto LAB_0010f362;
        }
      }
      else {
        if (((bVar1 == 0x22) || (bVar1 == 0x7b)) || (bVar1 == 0x5c)) goto joined_r0x0010f34d;
LAB_0010f362:
        if (i < 0x100) {
          yylval.symName[i] = bVar1;
          i = i + 1;
        }
      }
      bVar1 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar1 != 0);
  }
  return i;
}

Assistant:

static size_t appendEscapedSubstring(char const *str, size_t i)
{
	// Copy one extra to flag overflow
	while (*str) {
		char c = *str++;

		// Escape characters that need escaping
		switch (c) {
		case '\\':
		case '"':
		case '{':
			append_yylval_string('\\');
			break;
		case '\n':
			append_yylval_string('\\');
			c = 'n';
			break;
		case '\r':
			append_yylval_string('\\');
			c = 'r';
			break;
		case '\t':
			append_yylval_string('\\');
			c = 't';
			break;
		}

		append_yylval_string(c);
	}

	return i;
}